

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int send_certificate(ptls_t *tls,ptls_message_emitter_t *emitter,
                    st_ptls_signature_algorithms_t *signature_algorithms,ptls_iovec_t context,
                    int push_status_request,uint16_t *compress_algos,size_t num_compress_algos)

{
  int iVar1;
  ptls_emit_certificate_t *ppVar2;
  bool bVar3;
  
  if (signature_algorithms->count == 0) {
    iVar1 = 0x6d;
  }
  else {
    ppVar2 = tls->ctx->emit_certificate;
    if (ppVar2 == (st_ptls_emit_certificate_t *)0x0) {
      ppVar2 = &send_certificate::default_emit_certificate;
    }
    while( true ) {
      iVar1 = (*ppVar2->cb)(ppVar2,tls,emitter,tls->key_schedule,context,push_status_request,
                            compress_algos,num_compress_algos);
      if (iVar1 != 0x20a) break;
      bVar3 = ppVar2 == &send_certificate::default_emit_certificate;
      ppVar2 = &send_certificate::default_emit_certificate;
      if (bVar3) {
        __assert_fail("emit_certificate != &default_emit_certificate",
                      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                      ,0xc66,
                      "int send_certificate(ptls_t *, ptls_message_emitter_t *, struct st_ptls_signature_algorithms_t *, ptls_iovec_t, int, const uint16_t *, size_t)"
                     );
      }
    }
  }
  return iVar1;
}

Assistant:

static int send_certificate(ptls_t *tls, ptls_message_emitter_t *emitter,
                            struct st_ptls_signature_algorithms_t *signature_algorithms, ptls_iovec_t context,
                            int push_status_request, const uint16_t *compress_algos, size_t num_compress_algos)
{
    int ret;

    if (signature_algorithms->count == 0) {
        ret = PTLS_ALERT_MISSING_EXTENSION;
        goto Exit;
    }

    { /* send Certificate (or the equivalent) */
        static ptls_emit_certificate_t default_emit_certificate = {default_emit_certificate_cb};
        ptls_emit_certificate_t *emit_certificate =
            tls->ctx->emit_certificate != NULL ? tls->ctx->emit_certificate : &default_emit_certificate;
    Redo:
        if ((ret = emit_certificate->cb(emit_certificate, tls, emitter, tls->key_schedule, context, push_status_request,
                                        compress_algos, num_compress_algos)) != 0) {
            if (ret == PTLS_ERROR_DELEGATE) {
                assert(emit_certificate != &default_emit_certificate);
                emit_certificate = &default_emit_certificate;
                goto Redo;
            }
            goto Exit;
        }
    }

Exit:
    return ret;
}